

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab10.c
# Opt level: O2

int FeederBigSegment(void)

{
  DWORD DVar1;
  int iVar2;
  DWORD DVar3;
  FILE *__stream;
  ulong uVar4;
  ulong uVar5;
  char *__s;
  int i;
  uint uVar6;
  
  __stream = fopen("in.txt","w");
  if (__stream == (FILE *)0x0) {
    __s = "can\'t create in.txt. No space on disk?";
  }
  else {
    printf("Creating big segment... ");
    fflush(_stdout);
    DVar1 = GetTickCount();
    fprintf(__stream,"%d\n",100000);
    uVar6 = 99999;
    do {
      if ((int)uVar6 < 0) {
        DVar3 = GetTickCount();
        uVar6 = RoundUptoThousand(DVar3 - DVar1);
        printf("done in T=%u seconds. Starting exe with timeout 2*T+2... ",(ulong)uVar6 / 1000,
               (ulong)uVar6 % 1000);
        LabTimeout = uVar6 * 2 + 2000;
        LabMemoryLimit = 1;
        fflush(_stdout);
        fclose(__stream);
        return 0;
      }
      uVar5 = 0;
      if (bigSegmentsN != 2) {
        uVar5 = (ulong)uVar6;
      }
      uVar4 = 0;
      if (bigSegmentsN != 1) {
        uVar4 = (ulong)uVar6;
      }
      iVar2 = fprintf(__stream,"%d %d\n",uVar5,uVar4);
      uVar6 = uVar6 - 1;
    } while (1 < iVar2);
    fclose(__stream);
    __s = "can\'t create in.txt. No space on disk?\n";
  }
  puts(__s);
  return -1;
}

Assistant:

static int FeederBigSegment(void)
{
    FILE *const in = fopen("in.txt", "w");
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }

    printf("Creating big segment... ");
    fflush(stdout);
    DWORD t = GetTickCount();
    fprintf(in, "%d\n", MAX_POINT_COUNT);

    for (int i = MAX_POINT_COUNT - 1; i >= 0; --i) {
        int x = 0;
        int y = 0;

        if (bigSegmentsN != 2) {
            x = i;
        }
        if (bigSegmentsN != 1) {
            y = i;
        }
        
        if (fprintf(in, "%d %d\n", x, y) < 2) {
                fclose(in);
                printf("%s\n", "can't create in.txt. No space on disk?\n");
                return -1;
            }
    }

    t = RoundUptoThousand(GetTickCount() - t);
    printf("done in T=%u seconds. Starting exe with timeout 2*T+2... ", (unsigned)t/1000);
    LabTimeout = (int)t*2+2000;
    LabMemoryLimit = MIN_PROCESS_RSS_BYTES + 3*sizeof(TPoint)*MAX_POINT_COUNT;
    fflush(stdout);
    fclose(in);

    return 0;    
}